

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O1

void __thiscall
Clasp::WeightConstraint::WeightConstraint
          (WeightConstraint *this,Solver *s,SharedContext *ctx,Literal W,WeightLitsRep *rep,WL *out,
          uint32 act)

{
  undefined1 *puVar1;
  uint32 uVar2;
  WL WVar3;
  WeightLiteral *pWVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  uint *puVar8;
  WL *pWVar9;
  uint32 idx;
  long lVar10;
  bool bVar11;
  uint32 d;
  uint local_34;
  
  Constraint::Constraint(&this->super_Constraint);
  (this->super_Constraint)._vptr_Constraint = (_func_int **)&PTR_propagate_001eb180;
  if (rep->size == 0) {
    bVar11 = false;
  }
  else {
    bVar11 = 1 < rep->lits->second;
  }
  this->lits_ = out;
  uVar5 = *(uint *)&this->field_0x10;
  uVar6 = (act & 3) << 0x1c;
  *(uint *)&this->field_0x10 = uVar5 & 0xcfffffff | uVar6;
  *(uint *)&this->field_0x10 =
       (uVar5 & 0xc7ffffff | uVar6 | (uint)*out >> 3 & 0x8000000) ^ 0x8000000;
  *(uint32 *)&this->field_0x1c = W.rep_;
  this->bound_[0] = (rep->reach - rep->bound) + 1;
  this->bound_[1] = rep->bound;
  out[1] = (WL)(W.rep_ & 0xfffffffe ^ 2);
  if (bVar11) {
    out[2] = (WL)0x1;
    pWVar9 = out + 3;
  }
  else {
    pWVar9 = out + 2;
  }
  if (ctx != (SharedContext *)0x0) {
    SharedContext::setFrozen(ctx,W.rep_ >> 2,true);
  }
  uVar5 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(W.rep_ & 0xfffffffc));
  if ((uVar5 & 3) != 0 && uVar5 < 0x10) {
    *(uint *)&this->field_0x10 =
         *(uint *)&this->field_0x10 & 0xcfffffff |
         (uint)((bool)((byte)uVar5 & 3) == ((W.rep_ & 2) != 0)) << 0x1c;
  }
  puVar1 = &this->field_0x1c;
  uVar5 = 0x80000000;
  if (ctx != (SharedContext *)0x0) {
    uVar5 = ((~*(uint *)&this->field_0x10 & 0x30000000) == 0 | 0xfffffffe) << 0x1e;
  }
  *(uint *)&this->field_0x10 = *(uint *)&this->field_0x10 & 0x3fffffff | uVar5;
  uVar2 = rep->size;
  puVar8 = (uint *)puVar1;
  if (uVar2 != 0) {
    pWVar4 = rep->lits;
    lVar10 = 0;
    do {
      puVar8[1] = pWVar4[lVar10].first.rep_;
      *pWVar9 = (WL)pWVar4[lVar10].first.rep_;
      if (bVar11) {
        pWVar9[1] = (WL)pWVar4[lVar10].second;
        pWVar9 = pWVar9 + 2;
      }
      else {
        pWVar9 = pWVar9 + 1;
      }
      lVar10 = lVar10 + 1;
      idx = (uint32)lVar10;
      addWatch(this,s,idx,FTB_BFB);
      addWatch(this,s,idx,FFB_BTB);
      puVar8 = puVar8 + 1;
      if (ctx != (SharedContext *)0x0) {
        SharedContext::setFrozen(ctx,*puVar8 >> 2,true);
      }
    } while (uVar2 != idx);
  }
  plVar7 = (long *)((s->heuristic_).ptr_ & 0xfffffffffffffffe);
  bVar11 = (*(uint *)&this->field_0x10 & 0x30000000) == 0x30000000;
  (**(code **)(*plVar7 + 0x48))
            (plVar7,s,puVar8 + ((ulong)!bVar11 - (ulong)rep->size),(uint)bVar11 + rep->size,0);
  pWVar9 = this->lits_;
  WVar3 = *pWVar9;
  uVar5 = *(uint *)&this->field_0x10;
  *(uint *)&this->field_0x10 = uVar5 & 0xf8000000 | (uint)WVar3 >> 0x1f;
  *(undefined4 *)&this->field_0x1c = 0;
  this->bound_[(ulong)((uint)WVar3 >> 0x1f) + 2] = 0;
  if ((int)*pWVar9 < 0) {
    *(uint *)puVar1 = *(uint *)puVar1 & 1 | 2;
  }
  uVar6 = (s->assign_).assign_.ebo_.buf[W.rep_ >> 2];
  if (uVar6 < 0x10 && (uVar6 & 3) != 0) {
    local_34 = uVar5 >> 0x1c & 3;
    propagate(this,s,(Literal)((uint)pWVar9[1] & 0xfffffffe ^ local_34 * 2 ^ 2),&local_34);
  }
  else {
    addWatch(this,s,0,FTB_BFB);
    addWatch(this,s,0,FFB_BTB);
  }
  return;
}

Assistant:

WeightConstraint::WeightConstraint(Solver& s, SharedContext* ctx, Literal W, const WeightLitsRep& rep, WL* out, uint32 act) {
	typedef unsigned char Byte_t;
	const bool hasW = rep.hasWeights();
	lits_           = out;
	active_         = act;
	ownsLit_        = !out->shareable();
	Literal* p      = lits_->lits;
	Literal* h      = new (reinterpret_cast<Byte_t*>(undo_)) Literal(W);
	weight_t w      = 1;
	bound_[FFB_BTB]	= (rep.reach-rep.bound)+1; // ffb-btb
	bound_[FTB_BFB]	= rep.bound;               // ftb-bfb
	*p++            = ~W;                      // store constraint literal
	if (hasW) *p++  = Literal::fromRep(w);     // and weight if necessary
	if (ctx) ctx->setFrozen(W.var(), true);    // exempt from variable elimination
	if (s.topValue(W.var()) != value_free) {   // only one direction is relevant
		active_ = FFB_BTB+s.isFalse(W);
	}
	watched_        = 3u - (active_ != 3u || ctx == 0);
	WeightLiteral*x = rep.lits;
	for (uint32 sz = rep.size, j = 1; sz--; ++j, ++x) {
		h    = new (h + 1) Literal(x->first);
		*p++ = x->first;                         // store constraint literal
		w    = x->second;                        // followed by weight
		if (hasW) *p++= Literal::fromRep(w);     // if necessary
		addWatch(s, j, FTB_BFB);                 // watches  lits[idx]
		addWatch(s, j, FFB_BTB);                 // watches ~lits[idx]
		if (ctx) ctx->setFrozen(h->var(), true); // exempt from variable elimination
	}
	// init heuristic
	h -= rep.size;
	uint32 off = active_ != NOT_ACTIVE;
	assert((void*)h == (void*)undo_);
	s.heuristic()->newConstraint(s, h+off, rep.size+(1-off), Constraint_t::Static);
	// init undo stack
	up_                 = undoStart();     // undo stack is initially empty
	undo_[0].data       = 0;
	undo_[up_].data     = 0;
	setBpIndex(1);                         // where to start back propagation
	if (s.topValue(W.var()) == value_free){
		addWatch(s, 0, FTB_BFB);             // watch con in both phases
		addWatch(s, 0, FFB_BTB);             // in order to allow for backpropagation
	}
	else {
		uint32 d = active_;                  // propagate con
		WeightConstraint::propagate(s, ~lit(0, (ActiveConstraint)active_), d);
	}
}